

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgstrs.c
# Opt level: O1

void zgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  doublecomplex *pdVar13;
  void *pvVar14;
  void *pvVar15;
  long lVar16;
  bool bVar17;
  undefined8 uVar18;
  long lVar19;
  ulong uVar20;
  doublecomplex *Mxvec;
  doublecomplex *addr;
  doublecomplex *pdVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  float fVar38;
  int ii;
  
  *info = 0;
  piVar12 = (int *)B->Store;
  iVar8 = *piVar12;
  lVar19 = (long)iVar8;
  uVar9 = B->ncol;
  uVar20 = (ulong)uVar9;
  iVar22 = -1;
  if (trans < (CONJ|TRANS)) {
    iVar24 = L->nrow;
    iVar22 = -2;
    if ((((-1 < iVar24) && (iVar24 == L->ncol)) && (L->Stype == SLU_SC)) &&
       ((L->Dtype == SLU_Z && (L->Mtype == SLU_TRLU)))) {
      iVar22 = -3;
      if (((-1 < U->nrow) && ((U->nrow == U->ncol && (U->Stype == SLU_NC)))) &&
         ((U->Dtype == SLU_Z &&
          ((((U->Mtype == SLU_TRU && (iVar22 = -6, iVar24 <= iVar8)) && (B->Stype == SLU_DN)) &&
           ((B->Dtype == SLU_Z && (B->Mtype == SLU_GE)))))))) goto LAB_00106402;
    }
  }
  *info = iVar22;
LAB_00106402:
  if (*info == 0) {
    uVar10 = L->nrow;
    uVar31 = (ulong)uVar10;
    Mxvec = doublecomplexCalloc((long)(int)uVar9 * (long)(int)uVar10);
    if (Mxvec == (doublecomplex *)0x0) {
      sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d);
      superlu_abort_and_exit((char *)&ii);
    }
    addr = doublecomplexMalloc((long)(int)uVar10);
    if (addr == (doublecomplex *)0x0) {
      sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f);
      superlu_abort_and_exit((char *)&ii);
    }
    pdVar13 = *(doublecomplex **)(piVar12 + 2);
    if (trans == NOTRANS) {
      pvVar14 = L->Store;
      lVar29 = *(long *)((long)pvVar14 + 8);
      pvVar15 = U->Store;
      lVar16 = *(long *)((long)pvVar15 + 8);
      if (0 < (int)uVar9) {
        uVar25 = 0;
        pdVar21 = pdVar13;
        do {
          if (0 < (int)uVar10) {
            lVar30 = 0;
            do {
              iVar8 = *(int *)((long)perm_r + lVar30);
              pdVar36 = (double *)((long)&pdVar21->r + lVar30 * 4);
              dVar3 = pdVar36[1];
              addr[iVar8].r = *pdVar36;
              addr[iVar8].i = dVar3;
              lVar30 = lVar30 + 4;
            } while (uVar31 * 4 - lVar30 != 0);
          }
          if (0 < (int)uVar10) {
            lVar30 = 0;
            do {
              puVar1 = (undefined8 *)((long)&addr->r + lVar30);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pdVar21->r + lVar30);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              lVar30 = lVar30 + 0x10;
            } while (uVar31 << 4 != lVar30);
          }
          uVar25 = uVar25 + 1;
          pdVar21 = pdVar21 + lVar19;
        } while (uVar25 != uVar20);
      }
      uVar34 = *(uint *)((long)pvVar14 + 4);
      if ((int)uVar34 < 0) {
        fVar38 = 0.0;
      }
      else {
        fVar38 = 0.0;
        lVar30 = 0;
        do {
          lVar27 = (long)*(int *)(*(long *)((long)pvVar14 + 0x30) + lVar30 * 4);
          uVar34 = *(uint *)(*(long *)((long)pvVar14 + 0x20) + lVar27 * 4);
          iVar8 = *(int *)(*(long *)((long)pvVar14 + 0x20) + 4 + lVar27 * 4);
          iVar28 = iVar8 - uVar34;
          lVar23 = *(int *)(*(long *)((long)pvVar14 + 0x30) + 4 + lVar30 * 4) - lVar27;
          iVar22 = (int)lVar23;
          iVar24 = iVar28 - iVar22;
          if (iVar22 == 1) {
            if (0 < (int)uVar9) {
              iVar28 = *(int *)(*(long *)((long)pvVar14 + 0x10) + lVar27 * 4);
              uVar31 = 0;
              do {
                if ((int)(uVar34 + 1) < iVar8) {
                  lVar32 = uVar31 * lVar19;
                  lVar23 = *(long *)((long)pvVar14 + 0x18);
                  lVar35 = 0;
                  pdVar36 = (double *)((long)iVar28 * 0x10 + lVar29 + 0x18);
                  do {
                    lVar33 = (long)*(int *)(lVar23 + (long)(int)uVar34 * 4 + 4 + lVar35 * 4);
                    dVar3 = pdVar13[lVar32 + lVar27].r;
                    dVar4 = pdVar13[lVar32 + lVar27].i;
                    dVar5 = pdVar36[-1];
                    dVar6 = *pdVar36;
                    dVar7 = pdVar13[lVar32 + lVar33].i;
                    pdVar13[lVar32 + lVar33].r =
                         pdVar13[lVar32 + lVar33].r - (dVar3 * dVar5 - dVar6 * dVar4);
                    pdVar13[lVar32 + lVar33].i = dVar7 - (dVar4 * dVar5 + dVar3 * dVar6);
                    pdVar36 = pdVar36 + 2;
                    lVar35 = lVar35 + 1;
                  } while (~uVar34 + iVar8 != (int)lVar35);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar20);
            }
          }
          else if (0 < (int)uVar9) {
            lVar32 = (long)*(int *)(*(long *)((long)pvVar14 + 0x10) + lVar27 * 4);
            uVar31 = 0;
            do {
              lVar35 = uVar31 * lVar19;
              zlsolve(iVar28,iVar22,(doublecomplex *)(lVar32 * 0x10 + lVar29),
                      pdVar13 + lVar35 + lVar27);
              zmatvec(iVar28,iVar24,iVar22,(doublecomplex *)((lVar23 + lVar32) * 0x10 + lVar29),
                      pdVar13 + lVar35 + lVar27,Mxvec);
              if (0 < iVar24) {
                lVar33 = *(long *)((long)pvVar14 + 0x18);
                lVar37 = 0;
                pdVar21 = Mxvec;
                do {
                  lVar26 = (long)*(int *)(lVar33 + (long)(int)(uVar34 + iVar22) * 4 + lVar37 * 4);
                  dVar3 = pdVar13[lVar35 + lVar26].i;
                  pdVar13[lVar35 + lVar26].r = pdVar13[lVar35 + lVar26].r - pdVar21->r;
                  pdVar13[lVar35 + lVar26].i = dVar3 - pdVar21->i;
                  lVar37 = lVar37 + 1;
                  pdVar21->r = 0.0;
                  pdVar21->i = 0.0;
                  pdVar21 = pdVar21 + 1;
                } while (lVar37 < iVar24);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar20);
          }
          fVar38 = (float)(int)(uVar9 * 8 * iVar22 * iVar24) +
                   fVar38 + (float)(int)(uVar9 * 4 * iVar22 * (iVar22 + -1));
          uVar34 = *(uint *)((long)pvVar14 + 4);
          bVar17 = lVar30 < (int)uVar34;
          lVar30 = lVar30 + 1;
        } while (bVar17);
      }
      if (-1 < (int)uVar34) {
        uVar31 = (ulong)uVar34;
        do {
          iVar8 = *(int *)(*(long *)((long)pvVar14 + 0x30) + uVar31 * 4);
          lVar30 = (long)iVar8;
          iVar22 = *(int *)(*(long *)((long)pvVar14 + 0x30) + 4 + uVar31 * 4);
          iVar24 = iVar22 - iVar8;
          lVar23 = (long)*(int *)(*(long *)((long)pvVar14 + 0x10) + lVar30 * 4);
          if (iVar24 == 1) {
            if (0 < (int)uVar9) {
              pdVar21 = pdVar13 + lVar30;
              uVar25 = uVar20;
              do {
                z_div(pdVar21,pdVar21,(doublecomplex *)(lVar23 * 0x10 + lVar29));
                pdVar21 = pdVar21 + lVar19;
                uVar34 = (int)uVar25 - 1;
                uVar25 = (ulong)uVar34;
              } while (uVar34 != 0);
            }
          }
          else if (0 < (int)uVar9) {
            iVar28 = *(int *)(*(long *)((long)pvVar14 + 0x20) + 4 + lVar30 * 4);
            iVar11 = *(int *)(*(long *)((long)pvVar14 + 0x20) + lVar30 * 4);
            pdVar21 = pdVar13 + lVar30;
            uVar25 = uVar20;
            do {
              zusolve(iVar28 - iVar11,iVar24,(doublecomplex *)(lVar23 * 0x10 + lVar29),pdVar21);
              pdVar21 = pdVar21 + lVar19;
              uVar25 = uVar25 - 1;
            } while (uVar25 != 0);
          }
          fVar38 = fVar38 + (float)(int)((iVar24 + 1) * uVar9 * 4 * iVar24);
          if (0 < (int)uVar9) {
            uVar25 = 0;
            do {
              if (iVar8 < iVar22) {
                lVar32 = uVar25 * lVar19;
                lVar23 = *(long *)((long)pvVar15 + 0x18);
                lVar27 = lVar30;
                do {
                  iVar24 = *(int *)(lVar23 + 4 + lVar27 * 4);
                  iVar28 = *(int *)(lVar23 + lVar27 * 4);
                  lVar35 = (long)iVar28;
                  if (iVar24 - iVar28 != 0 && iVar28 <= iVar24) {
                    lVar33 = *(long *)((long)pvVar15 + 0x10);
                    pdVar36 = (double *)(lVar35 * 0x10 + lVar16 + 8);
                    do {
                      lVar37 = (long)*(int *)(lVar33 + lVar35 * 4);
                      dVar3 = pdVar13[lVar32 + lVar27].r;
                      dVar4 = pdVar13[lVar32 + lVar27].i;
                      dVar5 = pdVar36[-1];
                      dVar6 = *pdVar36;
                      dVar7 = pdVar13[lVar32 + lVar37].i;
                      pdVar13[lVar32 + lVar37].r =
                           pdVar13[lVar32 + lVar37].r - (dVar3 * dVar5 - dVar6 * dVar4);
                      pdVar13[lVar32 + lVar37].i = dVar7 - (dVar4 * dVar5 + dVar3 * dVar6);
                      lVar35 = lVar35 + 1;
                      pdVar36 = pdVar36 + 2;
                    } while (iVar24 != lVar35);
                  }
                  lVar27 = lVar27 + 1;
                  fVar38 = fVar38 + (float)((iVar24 - iVar28) * 8);
                } while (lVar27 != iVar22);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar20);
          }
          bVar17 = 0 < (long)uVar31;
          uVar31 = uVar31 - 1;
        } while (bVar17);
      }
      if (0 < (int)uVar9) {
        uVar31 = 0;
        pdVar21 = pdVar13;
        do {
          if (0 < (int)uVar10) {
            lVar29 = 0;
            do {
              dVar3 = pdVar13[uVar31 * lVar19 + (long)*(int *)((long)perm_c + lVar29)].i;
              pdVar36 = (double *)((long)&addr->r + lVar29 * 4);
              *pdVar36 = pdVar13[uVar31 * lVar19 + (long)*(int *)((long)perm_c + lVar29)].r;
              pdVar36[1] = dVar3;
              lVar29 = lVar29 + 4;
            } while ((ulong)uVar10 * 4 - lVar29 != 0);
          }
          if (0 < (int)uVar10) {
            lVar29 = 0;
            do {
              puVar1 = (undefined8 *)((long)&addr->r + lVar29);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pdVar21->r + lVar29);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              lVar29 = lVar29 + 0x10;
            } while ((ulong)uVar10 << 4 != lVar29);
          }
          uVar31 = uVar31 + 1;
          pdVar21 = pdVar21 + lVar19;
        } while (uVar31 != uVar20);
      }
      stat->ops[0x11] = fVar38;
    }
    else {
      if (0 < (int)uVar9) {
        uVar25 = 0;
        pdVar21 = pdVar13;
        do {
          if (0 < (int)uVar10) {
            lVar29 = 0;
            do {
              iVar8 = *(int *)((long)perm_c + lVar29);
              pdVar36 = (double *)((long)&pdVar21->r + lVar29 * 4);
              dVar3 = pdVar36[1];
              addr[iVar8].r = *pdVar36;
              addr[iVar8].i = dVar3;
              lVar29 = lVar29 + 4;
            } while (uVar31 * 4 - lVar29 != 0);
          }
          if (0 < (int)uVar10) {
            lVar29 = 0;
            do {
              puVar1 = (undefined8 *)((long)&addr->r + lVar29);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pdVar21->r + lVar29);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              lVar29 = lVar29 + 0x10;
            } while (uVar31 << 4 != lVar29);
          }
          uVar25 = uVar25 + 1;
          pdVar21 = pdVar21 + lVar19;
        } while (uVar25 != uVar20);
      }
      stat->ops[0x11] = 0.0;
      if (trans == TRANS) {
        pdVar21 = pdVar13;
        uVar25 = uVar20;
        if (0 < (int)uVar9) {
          do {
            sp_ztrsv("U","T","N",L,U,pdVar21,stat,info);
            sp_ztrsv("L","T","U",L,U,pdVar21,stat,info);
            uVar25 = uVar25 - 1;
            pdVar21 = pdVar21 + lVar19;
          } while (uVar25 != 0);
        }
      }
      else {
        pdVar21 = pdVar13;
        uVar25 = uVar20;
        if (0 < (int)uVar9) {
          do {
            sp_ztrsv("U","C","N",L,U,pdVar21,stat,info);
            sp_ztrsv("L","C","U",L,U,pdVar21,stat,info);
            uVar25 = uVar25 - 1;
            pdVar21 = pdVar21 + lVar19;
          } while (uVar25 != 0);
        }
      }
      if (0 < (int)uVar9) {
        uVar25 = 0;
        pdVar21 = pdVar13;
        do {
          if (0 < (int)uVar10) {
            lVar29 = 0;
            do {
              dVar3 = pdVar13[uVar25 * lVar19 + (long)*(int *)((long)perm_r + lVar29)].i;
              pdVar36 = (double *)((long)&addr->r + lVar29 * 4);
              *pdVar36 = pdVar13[uVar25 * lVar19 + (long)*(int *)((long)perm_r + lVar29)].r;
              pdVar36[1] = dVar3;
              lVar29 = lVar29 + 4;
            } while (uVar31 * 4 - lVar29 != 0);
          }
          if (0 < (int)uVar10) {
            lVar29 = 0;
            do {
              puVar1 = (undefined8 *)((long)&addr->r + lVar29);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pdVar21->r + lVar29);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              lVar29 = lVar29 + 0x10;
            } while (uVar31 << 4 != lVar29);
          }
          uVar25 = uVar25 + 1;
          pdVar21 = pdVar21 + lVar19;
        } while (uVar25 != uVar20);
      }
    }
    superlu_free(Mxvec);
    superlu_free(addr);
  }
  else {
    ii = -*info;
    input_error("zgstrs",&ii);
  }
  return;
}

Assistant:

void
zgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    doublecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex   *work_col;
#endif
    doublecomplex   temp_comp;
    DNformat *Bstore;
    doublecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    doublecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void zprint_soln(int n, int nrhs, const doublecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("zgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = doublecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = doublecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ztrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		zgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    zlsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    zmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    z_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ztrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    zusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			zz_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ztrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ztrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ztrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ztrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}